

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanceid.c
# Opt level: O2

LY_ERR lyplg_type_store_instanceid
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *ctx_node,
                 lyd_value *storage,lys_glob_unres *unres,ly_err_item **err)

{
  LY_ERR LVar1;
  LY_VALUE_FORMAT format_00;
  ly_path *path;
  lysc_type *local_40;
  char *canon;
  
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  storage->realtype = type;
  local_40 = type;
  LVar1 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
  if (LVar1 == LY_SUCCESS) {
    format_00 = LY_VALUE_JSON;
    if (format != LY_VALUE_LYB) {
      format_00 = format;
    }
    LVar1 = lyplg_type_lypath_new
                      (ctx,(char *)value,value_len,options,format_00,prefix_data,ctx_node,unres,
                       &path,err);
    if (LVar1 == LY_SUCCESS) {
      (storage->field_2).target = path;
      LVar1 = lyplg_type_lypath_check_status(ctx_node,path,format,prefix_data,err);
      if (LVar1 == LY_SUCCESS) {
        if (format == LY_VALUE_CANON) {
          if ((options & 1) != 0) {
            LVar1 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
            goto LAB_001aec01;
          }
          LVar1 = lydict_insert(ctx,(char *)value,value_len,&storage->_canonical);
        }
        else {
          LVar1 = instanceid_path2str(path,LY_VALUE_JSON,(void *)0x0,&canon);
          if (LVar1 == LY_SUCCESS) {
            LVar1 = lydict_insert_zc(ctx,canon,&storage->_canonical);
          }
        }
      }
    }
  }
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001aec01:
  if (LVar1 == LY_SUCCESS) {
    if (*(char *)&local_40[1].name != '\0') {
      LVar1 = LY_EINCOMPLETE;
    }
  }
  else {
    lyplg_type_free_instanceid(ctx,storage);
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_instanceid(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node,
        struct lyd_value *storage, struct lys_glob_unres *unres, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type_instanceid *type_inst = (struct lysc_type_instanceid *)type;
    struct ly_path *path;
    char *canon;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    storage->realtype = type;

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* compile instance-identifier into path */
    if (format == LY_VALUE_LYB) {
        /* value in LYB format is the same as in JSON format. */
        ret = lyplg_type_lypath_new(ctx, value, value_len, options, LY_VALUE_JSON, prefix_data, ctx_node,
                unres, &path, err);
    } else {
        ret = lyplg_type_lypath_new(ctx, value, value_len, options, format, prefix_data, ctx_node,
                unres, &path, err);
    }
    LY_CHECK_GOTO(ret, cleanup);

    /* store value */
    storage->target = path;

    /* check status */
    ret = lyplg_type_lypath_check_status(ctx_node, path, format, prefix_data, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* store canonical value */
    if (format == LY_VALUE_CANON) {
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value, value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret, cleanup);
        }
    } else {
        /* JSON format with prefix is the canonical one */
        ret = instanceid_path2str(path, LY_VALUE_JSON, NULL, &canon);
        LY_CHECK_GOTO(ret, cleanup);

        ret = lydict_insert_zc(ctx, canon, &storage->_canonical);
        LY_CHECK_GOTO(ret, cleanup);
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_instanceid(ctx, storage);
    }
    if (!ret && type_inst->require_instance) {
        /* needs to be resolved */
        return LY_EINCOMPLETE;
    } else {
        return ret;
    }
}